

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isac.c
# Opt level: O0

int16_t WebRtcIsac_SetDecSampRate(ISACStruct *ISAC_main_inst,uint16_t sample_rate_hz)

{
  int local_2c;
  IsacSamplingRate decoder_operational_rate;
  ISACMainStruct *instISAC;
  uint16_t sample_rate_hz_local;
  ISACStruct *ISAC_main_inst_local;
  
  if (sample_rate_hz == 16000) {
    local_2c = 0x10;
  }
  else {
    if (sample_rate_hz != 32000) {
      *(undefined2 *)(ISAC_main_inst + 0x538d0) = 0x17a2;
      return -1;
    }
    local_2c = 0x20;
  }
  if ((*(int *)(ISAC_main_inst + 0x538dc) == 0x10) && (local_2c == 0x20)) {
    memset(ISAC_main_inst + 0x538a0,0,0x18);
    memset(ISAC_main_inst + 0x538b8,0,0x18);
    DecoderInitUb((ISACUBStruct *)(ISAC_main_inst + 0x2b3d0));
  }
  *(int *)(ISAC_main_inst + 0x538dc) = local_2c;
  return 0;
}

Assistant:

int16_t WebRtcIsac_SetDecSampRate(ISACStruct* ISAC_main_inst,
                                  uint16_t sample_rate_hz) {
  ISACMainStruct* instISAC = (ISACMainStruct*)ISAC_main_inst;
  enum IsacSamplingRate decoder_operational_rate;

  if (sample_rate_hz == 16000) {
    decoder_operational_rate = kIsacWideband;
  } else if (sample_rate_hz == 32000) {
    decoder_operational_rate = kIsacSuperWideband;
  } else {
    /* Sampling Frequency is not supported. */
    instISAC->errorCode = ISAC_UNSUPPORTED_SAMPLING_FREQUENCY;
    return -1;
  }

  if ((instISAC->decoderSamplingRateKHz == kIsacWideband) &&
        (decoder_operational_rate == kIsacSuperWideband)) {
      /* Switching from wideband to super-wideband at the decoder
       * we need to reset the filter-bank and initialize upper-band decoder. */
      memset(instISAC->synthesisFBState1, 0,
             FB_STATE_SIZE_WORD32 * sizeof(int32_t));
      memset(instISAC->synthesisFBState2, 0,
             FB_STATE_SIZE_WORD32 * sizeof(int32_t));

      DecoderInitUb(&instISAC->instUB);
  }
  instISAC->decoderSamplingRateKHz = decoder_operational_rate;
  return 0;
}